

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O1

void __thiscall
ut::registry::add_test<agge::tests::CubicBezierCurveTests>
          (registry *this,offset_in_CubicBezierCurveTests_to_subr method,char *name)

{
  size_type __n;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  registry *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  void *__dest;
  char *in_RCX;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  shared_ptr<ut::test_case_impl<agge::tests::CubicBezierCurveTests>,_unsigned_int> tc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  shared_ptr<ut::setup_impl<agge::tests::CubicBezierCurveTests>,_unsigned_int> setup;
  allocator local_c9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  int *local_c0;
  value_type local_b8;
  _Base_ptr local_98;
  _Base_ptr local_90;
  pointer local_88;
  code *local_80;
  char *local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr p_Stack_60;
  registry *local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  get_setup<agge::tests::CubicBezierCurveTests>((registry *)&local_98);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_b8,in_RCX,(allocator *)&local_50);
  p_Var2 = local_90;
  p_Var1 = local_98;
  __n = local_b8._M_string_length;
  local_68 = local_98;
  p_Stack_60 = local_90;
  if (local_90 != (_Base_ptr)0x0) {
    local_90->_M_color = local_90->_M_color + 1;
  }
  paVar3->_M_allocated_capacity = (size_type)&PTR__test_case_impl_001c1930;
  (&paVar3->_M_allocated_capacity)[1] = method;
  (&paVar3->_M_allocated_capacity)[2] = (size_type)name;
  local_58 = this;
  __dest = operator_new__(local_b8._M_string_length + 1);
  (&paVar3->_M_allocated_capacity)[3] = (size_type)__dest;
  if ((int *)__n != (int *)0x0) {
    memmove(__dest,local_b8._M_dataplus._M_p,__n);
  }
  *(undefined1 *)((long)__dest + __n) = 0;
  (&paVar3->_M_allocated_capacity)[4] =
       (size_type)exportable::immutable_basic_string<char>::deallocate;
  (&paVar3->_M_allocated_capacity)[5] = (size_type)p_Var1;
  (&paVar3->_M_allocated_capacity)[6] = (size_type)p_Var2;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var2->_M_color = p_Var2->_M_color + 1;
  }
  local_c8 = paVar3;
  local_c0 = (int *)operator_new(4);
  this_00 = local_58;
  *local_c0 = 1;
  if ((p_Var2 != (_Base_ptr)0x0) &&
     (p_Var2->_M_color = p_Var2->_M_color + -1, p_Var2->_M_color == 0)) {
    if (p_Var1 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1 + 8))(p_Var1);
    }
    if (p_Stack_60 != (_Base_ptr)0x0) {
      operator_delete(p_Stack_60);
    }
  }
  local_68 = (_Base_ptr)0x0;
  p_Stack_60 = (_Base_ptr)0x0;
  paVar3 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  (**(code **)(local_c8->_M_allocated_capacity + 0x10))(&local_78);
  std::__cxx11::string::string((string *)&local_50,local_78,&local_c9);
  (**(code **)(local_c8->_M_allocated_capacity + 0x18))(&local_88);
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_50,local_50 + local_48);
  std::__cxx11::string::append((char *)&local_b8);
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_insert_unique(&(this_00->_registered_names)._M_t,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  (*local_80)(local_88);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  (*(code *)local_70)(local_78);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_b8._M_dataplus._M_p = (pointer)local_c8;
    local_b8._M_string_length = (size_type)local_c0;
    if (local_c0 != (int *)0x0) {
      *local_c0 = *local_c0 + 1;
    }
    std::
    vector<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
    ::push_back(&this_00->_test_cases,(value_type *)&local_b8);
    if (((int *)local_b8._M_string_length != (int *)0x0) &&
       (*(int *)local_b8._M_string_length = *(int *)local_b8._M_string_length + -1,
       *(int *)local_b8._M_string_length == 0)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_b8._M_dataplus._M_p + 8))();
      }
      if ((int *)local_b8._M_string_length != (int *)0x0) {
        operator_delete((void *)local_b8._M_string_length);
      }
    }
  }
  if ((local_c0 != (int *)0x0) && (*local_c0 = *local_c0 + -1, *local_c0 == 0)) {
    if (local_c8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(local_c8->_M_allocated_capacity + 8))();
    }
    if (local_c0 != (int *)0x0) {
      operator_delete(local_c0);
    }
  }
  if ((local_90 != (_Base_ptr)0x0) &&
     (local_90->_M_color = local_90->_M_color + -1, local_90->_M_color == 0)) {
    if (local_98 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
    if (local_90 != (_Base_ptr)0x0) {
      operator_delete(local_90);
    }
  }
  return;
}

Assistant:

inline void registry::add_test(void (FixtureT::*method)(), const char *name)
	{
		typedef test_case_impl<FixtureT> test_case;
		typedef setup_impl<FixtureT> fixture_setup;

		shared_ptr<fixture_setup> setup(get_setup<FixtureT>());
		shared_ptr<test_case> tc(new test_case_impl<FixtureT>(method, name, setup));

		if (_registered_names.insert(std::string(tc->fixture_name().c_str()) + tc->name().c_str()).second)
			_test_cases.push_back(tc);
	}